

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham.h
# Opt level: O1

void __thiscall lzham_static_lib::unload(lzham_static_lib *this)

{
  memset(&(this->super_ilzham).lzham_get_version,0,0xf0);
  return;
}

Assistant:

void clear()
   {
      this->lzham_get_version = NULL;
      this->lzham_set_memory_callbacks = NULL;
      
      this->lzham_compress_init = NULL;
      this->lzham_compress_reinit = NULL;
      this->lzham_compress_deinit = NULL;
      this->lzham_compress = NULL;
      this->lzham_compress2 = NULL;
      this->lzham_compress_memory = NULL;
      
      this->lzham_decompress_init = NULL;
      this->lzham_decompress_reinit = NULL;
      this->lzham_decompress_deinit = NULL;
      this->lzham_decompress = NULL;
      this->lzham_decompress_memory = NULL;

      this->lzham_z_version = NULL;
      this->lzham_z_deflateInit = NULL;
      this->lzham_z_deflateInit2 = NULL;
      this->lzham_z_deflateReset = NULL;
      this->lzham_z_deflate = NULL;
      this->lzham_z_deflateEnd = NULL;
      this->lzham_z_deflateBound = NULL;
      this->lzham_z_compress = NULL;
      this->lzham_z_compress2 = NULL;
      this->lzham_z_compressBound = NULL;
      this->lzham_z_inflateInit = NULL;
      this->lzham_z_inflateInit2 = NULL;
      this->lzham_z_inflate = NULL;
      this->lzham_z_inflateEnd = NULL;
      this->lzham_z_inflateReset = NULL;
      this->lzham_z_uncompress = NULL;
      this->lzham_z_error = NULL;
   }